

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextGLImpl::DrawIndirect(DeviceContextGLImpl *this,DrawIndirectAttribs *Attribs)

{
  GLContextState *this_00;
  IBuffer *pIVar1;
  DeviceContextGLImpl *pDVar2;
  ulong uVar3;
  GLenum err;
  GLenum GlTopology;
  string msg;
  uint local_60;
  GLenum local_5c;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  DeviceContextGLImpl *local_38;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DrawIndirect
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PrepareForDraw(this,Attribs->Flags,true,&local_5c);
  pIVar1 = Attribs->pAttribsBuffer;
  if (pIVar1 != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferGLImpl,Diligent::IBuffer>(pIVar1);
  }
  this_00 = &this->m_ContextState;
  GLContextState::EnsureMemoryBarrier
            (this_00,MEMORY_BARRIER_INDIRECT_BUFFER,(AsyncWritableResource *)(pIVar1 + 0x11));
  GLContextState::BindBuffer
            (this_00,0x8f3f,
             (GLBufferObj *)
             ((long)&pIVar1[0x11].super_IDeviceObject.super_IObject._vptr_IObject + 4),false);
  pIVar1 = Attribs->pCounterBuffer;
  local_38 = this;
  if (pIVar1 == (IBuffer *)0x0) {
    if ((Attribs->DrawCount < 2) ||
       (((((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice.m_pObject)->
         super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_AdapterInfo.DrawCommand.CapFlags &
        DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT) == DRAW_COMMAND_CAP_FLAG_NONE)) {
      if (Attribs->DrawCount != 0) {
        uVar3 = 0;
        do {
          (*__glewDrawArraysIndirect)
                    (local_5c,(void *)(Attribs->DrawArgsStride * uVar3 + Attribs->DrawArgsOffset));
          local_60 = glGetError();
          if (local_60 != 0) {
            LogError<false,char[30],char[17],unsigned_int>
                      (false,"DrawIndirect",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                       ,0x4c4,(char (*) [30])"glDrawArraysIndirect() failed",
                       (char (*) [17])"\nGL Error Code: ",&local_60);
            FormatString<char[6]>((string *)local_58,(char (*) [6])0x32952e);
            DebugAssertionFailed
                      ((Char *)local_58._0_8_,"DrawIndirect",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                       ,0x4c4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._0_8_ != &local_48) {
              operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
            }
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < Attribs->DrawCount);
      }
    }
    else {
      (*__glewMultiDrawArraysIndirect)
                (local_5c,(void *)Attribs->DrawArgsOffset,Attribs->DrawCount,Attribs->DrawArgsStride
                );
      local_60 = glGetError();
      if (local_60 != 0) {
        LogError<false,char[35],char[17],unsigned_int>
                  (false,"DrawIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x4b0,(char (*) [35])"glMultiDrawArraysIndirect() failed",
                   (char (*) [17])"\nGL Error Code: ",&local_60);
        FormatString<char[6]>((string *)local_58,(char (*) [6])0x32952e);
        DebugAssertionFailed
                  ((Char *)local_58._0_8_,"DrawIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._0_8_ != &local_48) {
          operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
        }
      }
    }
  }
  else {
    CheckDynamicType<Diligent::BufferGLImpl,Diligent::IBuffer>(pIVar1);
    GLContextState::EnsureMemoryBarrier
              (this_00,MEMORY_BARRIER_INDIRECT_BUFFER,(AsyncWritableResource *)(pIVar1 + 0x11));
    GLContextState::BindBuffer
              (this_00,0x80ee,
               (GLBufferObj *)
               ((long)&pIVar1[0x11].super_IDeviceObject.super_IObject._vptr_IObject + 4),false);
    (*__glewMultiDrawArraysIndirectCount)
              (local_5c,(GLvoid *)Attribs->DrawArgsOffset,Attribs->CounterOffset,Attribs->DrawCount,
               Attribs->DrawArgsStride);
    local_60 = glGetError();
    if (local_60 != 0) {
      LogError<false,char[40],char[17],unsigned_int>
                (false,"DrawIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x4d5,(char (*) [40])"glMultiDrawArraysIndirectCount() failed",
                 (char (*) [17])"\nGL Error Code: ",&local_60);
      FormatString<char[6]>((string *)local_58,(char (*) [6])0x32952e);
      DebugAssertionFailed
                ((Char *)local_58._0_8_,"DrawIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x4d5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
      }
    }
    local_58._0_8_ = (pointer)0x0;
    local_58._8_4_ = 0;
    GLContextState::BindBuffer(this_00,0x80ee,(GLBufferObj *)local_58,false);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
              ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)local_58);
  }
  local_58._0_8_ = (pointer)0x0;
  local_58._8_4_ = 0;
  GLContextState::BindBuffer(this_00,0x8f3f,(GLBufferObj *)local_58,false);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)local_58);
  pDVar2 = local_38;
  GLContextState::SetPendingMemoryBarriers(this_00,local_38->m_CommittedResourcesTentativeBarriers);
  pDVar2->m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;
  return;
}

Assistant:

void DeviceContextGLImpl::DrawIndirect(const DrawIndirectAttribs& Attribs)
{
    TDeviceContextBase::DrawIndirect(Attribs, 0);

    GLenum GlTopology;
    PrepareForDraw(Attribs.Flags, true, GlTopology);

    // http://www.opengl.org/wiki/Vertex_Rendering
    PrepareForIndirectDraw(Attribs.pAttribsBuffer);

    if (Attribs.pCounterBuffer == nullptr)
    {
        bool NativeMultiDrawExecuted = false;
        if (Attribs.DrawCount > 1)
        {
#if GL_ARB_multi_draw_indirect
            if ((m_pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT) != 0)
            {
                glMultiDrawArraysIndirect(GlTopology,
                                          reinterpret_cast<const void*>(StaticCast<size_t>(Attribs.DrawArgsOffset)),
                                          Attribs.DrawCount,
                                          Attribs.DrawArgsStride);
                DEV_CHECK_GL_ERROR("glMultiDrawArraysIndirect() failed");
                NativeMultiDrawExecuted = true;
            }
#endif
        }

        if (!NativeMultiDrawExecuted)
        {
#if GL_ARB_draw_indirect
            for (Uint32 draw = 0; draw < Attribs.DrawCount; ++draw)
            {
                Uint64 Offset = Attribs.DrawArgsOffset + draw * Uint64{Attribs.DrawArgsStride};
                //typedef  struct {
                //   GLuint  count;
                //   GLuint  instanceCount;
                //   GLuint  first;
                //   GLuint  baseInstance;
                //} DrawArraysIndirectCommand;
                glDrawArraysIndirect(GlTopology, reinterpret_cast<const void*>(StaticCast<size_t>(Offset)));
                // Note that on GLES 3.1, baseInstance is present but reserved and must be zero
                DEV_CHECK_GL_ERROR("glDrawArraysIndirect() failed");
            }
#else
            LOG_ERROR_MESSAGE("Indirect rendering is not supported");
#endif
        }
    }
    else
    {
        PrepareForIndirectDrawCount(Attribs.pCounterBuffer);

#if GL_VERSION_4_6
        glMultiDrawArraysIndirectCount(GlTopology,
                                       reinterpret_cast<const void*>(StaticCast<size_t>(Attribs.DrawArgsOffset)),
                                       StaticCast<GLintptr>(Attribs.CounterOffset),
                                       Attribs.DrawCount,
                                       Attribs.DrawArgsStride);
        DEV_CHECK_GL_ERROR("glMultiDrawArraysIndirectCount() failed");

        constexpr bool ResetVAO = false; // GL_PARAMETER_BUFFER does not affect VAO
        m_ContextState.BindBuffer(GL_PARAMETER_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);
#else
        LOG_ERROR_MESSAGE("Multi indirect count rendering is not supported");
#endif
    }

    constexpr bool ResetVAO = false; // GL_DRAW_INDIRECT_BUFFER does not affect VAO
    m_ContextState.BindBuffer(GL_DRAW_INDIRECT_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);

    PostDraw();
}